

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

void __thiscall
spatial_region::add_beam
          (spatial_region *this,double cmr,double n0,double u0,double xb,double rb,double x0b,
          double y0b,double phib)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  celle *pcVar11;
  cellb *pcVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  long lVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  double dVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ulong in_XMM3_Qb;
  undefined8 in_XMM4_Qb;
  ulong in_XMM5_Qb;
  ulong in_XMM6_Qb;
  undefined8 in_XMM8_Qb;
  int_vector3d a;
  undefined1 local_198 [16];
  int_vector3d local_144;
  int_vector3d local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  double local_b8;
  ulong uStack_b0;
  double local_a8;
  ulong uStack_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  ulong uStack_40;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  
  local_138.i = this->xnpic;
  local_138.j = this->ynpic;
  local_138.k = this->znpic;
  if (0 < this->nx) {
    local_f0 = (double)(int)((uint)(0.0 < cmr) - (uint)(cmr < 0.0));
    local_a8 = -y0b;
    uStack_a0 = in_XMM6_Qb ^ 0x8000000000000000;
    local_b8 = -x0b;
    uStack_b0 = in_XMM5_Qb ^ 0x8000000000000000;
    auVar14._8_8_ = in_XMM3_Qb;
    auVar14._0_8_ = xb;
    local_48 = -xb;
    uStack_40 = in_XMM3_Qb ^ 0x8000000000000000;
    auVar35._8_8_ = in_XMM4_Qb;
    auVar35._0_8_ = rb;
    auVar35 = vunpcklpd_avx(auVar14,auVar35);
    local_58 = auVar35._0_8_ * auVar35._0_8_;
    dStack_50 = auVar35._8_8_ * auVar35._8_8_;
    local_80 = n0 * 0.5;
    local_88 = (rb + rb) * rb;
    local_f8 = local_f0 * (double)(int)((uint)(0.0 < u0) - (uint)(u0 < 0.0));
    local_90 = n0 * 0.25;
    local_98 = xb * xb;
    lVar30 = 0;
    local_100 = n0;
    local_e8 = rb;
    local_78 = cmr;
    local_68 = xb;
    uStack_60 = in_XMM3_Qb;
    do {
      if (0 < this->ny) {
        dVar36 = (double)(int)lVar30;
        lVar32 = 0;
        do {
          if (0 < this->nz) {
            lVar29 = 0;
            lVar33 = 0;
            do {
              iVar31 = (int)lVar32;
              local_144.j = iVar31;
              local_144.i = (int)lVar30;
              auVar40._0_8_ = (double)(iVar31 - this->ny / 2);
              auVar40._8_8_ = in_XMM8_Qb;
              auVar23._8_8_ = uStack_a0;
              auVar23._0_8_ = local_a8;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = this->dy;
              auVar35 = vfmadd132sd_fma(auVar40,auVar23,auVar1);
              auVar56._8_8_ = 0;
              auVar56._0_8_ = this->dx;
              auVar21._8_8_ = uStack_b0;
              auVar21._0_8_ = local_b8;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = dVar36;
              auVar14 = vfmadd132sd_fma(auVar56,auVar21,auVar2);
              local_144.k = (int)lVar33;
              dVar37 = atan2(auVar35._0_8_,auVar14._0_8_);
              auVar57._8_8_ = 0;
              auVar57._0_8_ = this->dx;
              auVar41._0_8_ = (double)(iVar31 - this->ny / 2);
              auVar41._8_8_ = in_XMM8_Qb;
              auVar22._8_8_ = uStack_b0;
              auVar22._0_8_ = local_b8;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = dVar36;
              auVar35 = vfmadd132sd_fma(auVar57,auVar22,auVar3);
              auVar24._8_8_ = uStack_a0;
              auVar24._0_8_ = local_a8;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = this->dy;
              auVar14 = vfmadd132sd_fma(auVar41,auVar24,auVar4);
              auVar42._8_8_ = 0;
              auVar42._0_8_ = auVar14._0_8_ * auVar14._0_8_;
              auVar35 = vfmadd231sd_fma(auVar42,auVar35,auVar35);
              if (auVar35._0_8_ < 0.0) {
                dVar39 = sqrt(auVar35._0_8_);
              }
              else {
                auVar35 = vsqrtsd_avx(auVar35,auVar35);
                dVar39 = auVar35._0_8_;
              }
              dVar38 = cos(dVar37 - phib);
              local_118._0_8_ = dVar38;
              auVar58._8_8_ = 0;
              auVar58._0_8_ = this->dx;
              auVar43._0_8_ = (double)(iVar31 - this->ny / 2);
              auVar43._8_8_ = in_XMM6_Qb;
              auVar62._8_8_ = 0;
              auVar62._0_8_ = dVar36;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = local_b8;
              auVar14 = vfmadd213sd_fma(auVar58,auVar62,auVar5);
              auVar25._8_8_ = uStack_a0;
              auVar25._0_8_ = local_a8;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = this->dy;
              auVar35 = vfmadd132sd_fma(auVar43,auVar25,auVar6);
              auVar44._8_8_ = 0;
              auVar44._0_8_ = auVar35._0_8_ * auVar35._0_8_;
              auVar35 = vfmadd231sd_fma(auVar44,auVar14,auVar14);
              if (auVar35._0_8_ < 0.0) {
                dVar38 = sqrt(auVar35._0_8_);
              }
              else {
                auVar35 = vsqrtsd_avx(auVar35,auVar35);
                dVar38 = auVar35._0_8_;
              }
              dVar37 = sin(dVar37 - phib);
              dVar37 = dVar37 * dVar38;
              dVar38 = (double)((int)lVar33 - this->nz / 2) * this->dz;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = dVar37;
              auVar45._8_8_ = 0;
              auVar45._0_8_ = dVar38 * dVar38;
              auVar64._8_8_ = 0;
              auVar64._0_8_ = dVar37;
              auVar35 = vfmadd231sd_fma(auVar45,auVar63,auVar64);
              if (auVar35._0_8_ < 0.0) {
                auVar47._0_8_ = sqrt(auVar35._0_8_);
                auVar47._8_56_ = extraout_var;
                auVar35 = auVar47._0_16_;
              }
              else {
                auVar35 = vsqrtsd_avx(auVar35,auVar35);
              }
              dVar61 = auVar35._0_8_;
              dVar39 = (double)local_118._0_8_ * dVar39;
              auVar28._8_8_ = uStack_40;
              auVar28._0_8_ = local_48;
              auVar59._8_8_ = 0;
              auVar59._0_8_ = dVar39;
              uVar13 = vcmppd_avx512vl(auVar59,auVar28,0xe);
              auVar26._8_8_ = uStack_60;
              auVar26._0_8_ = local_68;
              uVar34 = vcmppd_avx512vl(auVar59,auVar26,1);
              uVar34 = ((byte)uVar13 & 3) & uVar34;
              if (((uVar34 & 1) != 0) && (dVar61 < local_e8)) {
                local_c8._8_8_ = 0;
                local_c8._0_8_ = dVar39;
                auVar14 = vunpcklpd_avx(local_c8,auVar35);
                auVar46._0_8_ = auVar14._0_8_ * auVar14._0_8_;
                auVar46._8_8_ = auVar14._8_8_ * auVar14._8_8_;
                auVar27._8_8_ = dStack_50;
                auVar27._0_8_ = local_58;
                auVar14 = vdivpd_avx(auVar46,auVar27);
                auVar60._8_8_ = 0x3ff0000000000000;
                auVar60._0_8_ = 0x3ff0000000000000;
                local_128 = vsubpd_avx(auVar60,auVar14);
                auVar14 = vshufpd_avx(local_128,local_128,1);
                local_d8._0_8_ = local_128._0_8_ * local_100 * auVar14._0_8_;
                local_118 = auVar35;
                local_70 = cos(phib);
                local_70 = local_70 * u0;
                dVar39 = sin(phib);
                fill_cell_by_particles
                          (this,local_78,&local_144,&local_138,(double)local_d8._0_8_,local_70,
                           dVar39 * u0,0.0,0.0);
                auVar35 = vpermilpd_avx(auVar46,1);
                dVar39 = (double)local_128._0_8_ * local_80 * (1.0 - auVar35._0_8_ / local_88);
                auVar48._0_8_ = sin(phib);
                auVar48._8_56_ = extraout_var_00;
                pcVar11 = (this->ce).p._M_t.
                          super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                          super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar30][lVar32];
                local_128._0_8_ = dVar39 * local_f0;
                local_128._8_8_ = 0;
                local_d8._8_8_ = 0;
                local_d8._0_8_ = (double)local_128._0_8_ * dVar37;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = *(ulong *)((long)&pcVar11->ex + lVar29);
                auVar35 = vfnmadd213sd_fma(auVar48._0_16_,local_d8,auVar7);
                *(long *)((long)&pcVar11->ex + lVar29) = auVar35._0_8_;
                auVar49._0_8_ = cos(phib);
                auVar49._8_56_ = extraout_var_01;
                pcVar11 = (this->ce).p._M_t.
                          super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                          super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar30][lVar32];
                auVar35 = vunpcklpd_avx(local_d8,local_128);
                auVar17._8_8_ = 0;
                auVar17._0_8_ = dVar38;
                auVar14 = vunpcklpd_avx(auVar49._0_16_,auVar17);
                auVar35 = vfmadd213pd_fma(auVar14,auVar35,
                                          *(undefined1 (*) [16])((long)&pcVar11->ey + lVar29));
                *(undefined1 (*) [16])((long)&pcVar11->ey + lVar29) = auVar35;
                local_128._0_8_ = dVar39 * local_f8;
                local_128._8_8_ = 0;
                local_198._8_8_ = 0;
                local_198._0_8_ = dVar38 * (double)local_128._0_8_;
                auVar50._0_8_ = sin(phib);
                auVar50._8_56_ = extraout_var_02;
                pcVar12 = (this->cb).p._M_t.
                          super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                          super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar30][lVar32];
                auVar8._8_8_ = 0;
                auVar8._0_8_ = *(ulong *)((long)&pcVar12->bx + lVar29);
                auVar35 = vfmadd213sd_fma(auVar50._0_16_,local_198,auVar8);
                *(long *)((long)&pcVar12->bx + lVar29) = auVar35._0_8_;
                auVar51._0_8_ = cos(phib);
                auVar51._8_56_ = extraout_var_03;
                dVar61 = local_118._0_8_;
                pcVar12 = (this->cb).p._M_t.
                          super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                          super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar30][lVar32];
                auVar15._8_8_ = 0x8000000000000000;
                auVar15._0_8_ = 0x8000000000000000;
                auVar35 = vxorpd_avx512vl(local_198,auVar15);
                auVar35 = vunpcklpd_avx(auVar35,local_128);
                auVar14 = vunpcklpd_avx(auVar51._0_16_,auVar63);
                auVar35 = vfmadd213pd_fma(auVar14,auVar35,
                                          *(undefined1 (*) [16])((long)&pcVar12->by + lVar29));
                dVar39 = local_c8._0_8_;
                *(undefined1 (*) [16])((long)&pcVar12->by + lVar29) = auVar35;
              }
              if ((local_e8 <= dVar61 & (byte)uVar34) == 1) {
                local_198._0_8_ =
                     ((1.0 - (dVar39 * dVar39) / local_98) * local_90 * local_e8 * local_e8) /
                     (dVar61 * dVar61);
                auVar52._0_8_ = sin(phib);
                auVar52._8_56_ = extraout_var_04;
                pcVar11 = (this->ce).p._M_t.
                          super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                          super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar30][lVar32];
                local_118._0_8_ = (double)local_198._0_8_ * local_f0;
                local_118._8_8_ = 0;
                local_c8._8_8_ = 0;
                local_c8._0_8_ = (double)local_118._0_8_ * dVar37;
                auVar9._8_8_ = 0;
                auVar9._0_8_ = *(ulong *)((long)&pcVar11->ex + lVar29);
                auVar35 = vfnmadd213sd_fma(auVar52._0_16_,local_c8,auVar9);
                *(long *)((long)&pcVar11->ex + lVar29) = auVar35._0_8_;
                auVar53._0_8_ = cos(phib);
                auVar53._8_56_ = extraout_var_05;
                pcVar11 = (this->ce).p._M_t.
                          super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                          super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar30][lVar32];
                auVar35 = vunpcklpd_avx(local_c8,local_118);
                auVar18._8_8_ = 0;
                auVar18._0_8_ = dVar38;
                auVar14 = vunpcklpd_avx(auVar53._0_16_,auVar18);
                auVar35 = vfmadd213pd_fma(auVar14,auVar35,
                                          *(undefined1 (*) [16])((long)&pcVar11->ey + lVar29));
                *(undefined1 (*) [16])((long)&pcVar11->ey + lVar29) = auVar35;
                local_198._0_8_ = (double)local_198._0_8_ * local_f8;
                local_198._8_8_ = 0;
                dVar38 = dVar38 * (double)local_198._0_8_;
                auVar54._0_8_ = sin(phib);
                auVar54._8_56_ = extraout_var_06;
                pcVar12 = (this->cb).p._M_t.
                          super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                          super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar30][lVar32];
                auVar19._8_8_ = 0;
                auVar19._0_8_ = dVar38;
                auVar10._8_8_ = 0;
                auVar10._0_8_ = *(ulong *)((long)&pcVar12->bx + lVar29);
                auVar35 = vfmadd213sd_fma(auVar54._0_16_,auVar19,auVar10);
                *(long *)((long)&pcVar12->bx + lVar29) = auVar35._0_8_;
                auVar55._0_8_ = cos(phib);
                auVar55._8_56_ = extraout_var_07;
                pcVar12 = (this->cb).p._M_t.
                          super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                          super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar30][lVar32];
                auVar20._8_8_ = 0;
                auVar20._0_8_ = dVar38;
                auVar16._8_8_ = 0x8000000000000000;
                auVar16._0_8_ = 0x8000000000000000;
                auVar35 = vxorpd_avx512vl(auVar20,auVar16);
                auVar35 = vunpcklpd_avx(auVar35,local_198);
                auVar14 = vunpcklpd_avx(auVar55._0_16_,auVar63);
                auVar35 = vfmadd213pd_fma(auVar14,auVar35,
                                          *(undefined1 (*) [16])((long)&pcVar12->by + lVar29));
                *(undefined1 (*) [16])((long)&pcVar12->by + lVar29) = auVar35;
              }
              lVar33 = lVar33 + 1;
              lVar29 = lVar29 + 0x18;
            } while (lVar33 < this->nz);
          }
          lVar32 = lVar32 + 1;
        } while (lVar32 < this->ny);
      }
      lVar30 = lVar30 + 1;
    } while (lVar30 < this->nx);
  }
  return;
}

Assistant:

void spatial_region::add_beam(double cmr, double n0, double u0, double xb, double rb, double x0b, double y0b, double phib)
{
    /* Добавляет электронный пучок с полями, вычисленными в
     * приближении бесконечного гамма-фактора пучка. n0 - максимальная
     * концентрация электронов в пучке, нормированная на критическую
     * концентрацию. phib - направление (в плоскости xy), в котором пучок распространяется
     */

    int_vector3d a,b;
    b.i = xnpic;
    b.j = ynpic;
    b.k = znpic;
    double x, y, z, r, n, f_ampl, signum, type, phi;
    signum = (u0>0) - (u0<0);
    type = (cmr>0)-(cmr<0);
    for(int i=0; i<nx; i++)
    {
        for(int j=0; j<ny; j++)
        {
            for(int k=0; k<nz; k++)
            {
                a.i = i;
                a.j = j;
                a.k = k;
                phi = atan2((j-ny/2)*dy-y0b, i*dx-x0b);
                // x,y,z are in the rotated (by phib) coordinate system
                x = sqrt((i*dx-x0b)*(i*dx-x0b) + ((j-ny/2)*dy-y0b)*((j-ny/2)*dy-y0b)) * cos(phi - phib);
                y = sqrt((i*dx-x0b)*(i*dx-x0b) + ((j-ny/2)*dy-y0b)*((j-ny/2)*dy-y0b)) * sin(phi - phib);
                z = (k-nz/2)*dz;
                r = sqrt(y*y + z*z);
                if (x>-xb && x<xb && r<rb)
                {
                    n = n0*(1-x*x/(xb*xb))*(1-r*r/(rb*rb));
                    fill_cell_by_particles(cmr,a,b,n,u0*cos(phib),u0*sin(phib));
                    f_ampl = 0.5*n0*(1-x*x/(xb*xb))*(1-r*r/(2*rb*rb));
                    ce[i][j][k].ex -= type*f_ampl*y * sin(phib);
                    ce[i][j][k].ey += type*f_ampl*y * cos(phib);
                    ce[i][j][k].ez += type*f_ampl*z;
                    cb[i][j][k].bx += type*signum*f_ampl*z * sin(phib);
                    cb[i][j][k].by -= type*signum*f_ampl*z * cos(phib);
                    cb[i][j][k].bz += type*signum*f_ampl*y;
                }
                if (x>-xb && x<xb && r>=rb)
                {
                    f_ampl = 0.25*n0*(1-x*x/(xb*xb))*rb*rb/(r*r);
                    ce[i][j][k].ex -= type*f_ampl*y * sin(phib);
                    ce[i][j][k].ey += type*f_ampl*y * cos(phib);
                    ce[i][j][k].ez += type*f_ampl*z;
                    cb[i][j][k].bx += type*signum*f_ampl*z * sin(phib);
                    cb[i][j][k].by -= type*signum*f_ampl*z * cos(phib);
                    cb[i][j][k].bz += type*signum*f_ampl*y;
                }
            }
        }
    }
}